

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O2

RatioSequence * __thiscall
RatioSequence::getNonDesRSWithMinDist(RatioSequence *__return_storage_ptr__,RatioSequence *this)

{
  vector<Ratio,_std::allocator<Ratio>_> *c;
  pointer pRVar1;
  pointer pRVar2;
  RatioSequence *pRVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  size_t k;
  ulong index;
  double dVar10;
  undefined1 auVar11 [16];
  vector<int,_std::allocator<int>_> ccArray;
  Ratio combinedRatio;
  allocator_type local_a1;
  RatioSequence *local_a0;
  RatioSequence *local_98;
  double local_90;
  _Vector_base<int,_std::allocator<int>_> local_88;
  Ratio local_70;
  
  pRVar1 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar2 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_start;
  RatioSequence(__return_storage_ptr__,this);
  if (0x40 < (ulong)((long)pRVar1 - (long)pRVar2)) {
    local_70.eLength._0_4_ = 0;
    local_a0 = this;
    local_98 = __return_storage_ptr__;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_88,
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 6,(value_type_conflict3 *)&local_70
               ,&local_a1);
    c = &__return_storage_ptr__->_RatioSequence;
    uVar6 = 0;
    index = 0;
    while (pRVar3 = local_a0,
          pRVar1 = (__return_storage_ptr__->_RatioSequence).
                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.super__Vector_impl_data
                   ._M_start,
          index < ((long)(__return_storage_ptr__->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pRVar1 >> 6) - 1U) {
      local_90 = Ratio::getRatio(pRVar1 + index);
      uVar5 = index + 1;
      dVar10 = Ratio::getRatio((c->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                               super__Vector_impl_data._M_start + uVar5);
      if (local_90 <= dVar10) {
        uVar4 = (ulong)(int)uVar6;
        local_88._M_impl.super__Vector_impl_data._M_start[uVar4] = 0;
        uVar7 = ((long)(local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_a0->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) - 1;
        uVar8 = uVar4;
        if (uVar4 < uVar7) {
          uVar8 = uVar7;
        }
        for (; (uVar6 = uVar8, __return_storage_ptr__ = local_98, index = uVar5, uVar4 < uVar7 &&
               (uVar6 = uVar4, local_88._M_impl.super__Vector_impl_data._M_start[uVar4] != 2));
            uVar4 = uVar4 + 1) {
        }
      }
      else {
        pRVar1 = (c->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Ratio::combine(&local_70,pRVar1 + index,pRVar1 + uVar5);
        Tools::vector_remove_element_at_index<Ratio>(c,index);
        Tools::vector_remove_element_at_index<Ratio>(c,index);
        std::vector<Ratio,_std::allocator<Ratio>_>::insert
                  (c,(c->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                     super__Vector_impl_data._M_start + index,&local_70);
        uVar5 = (ulong)(int)uVar6;
        local_88._M_impl.super__Vector_impl_data._M_start[uVar5] = 1;
        if (index == 0) {
          uVar6 = ((long)(local_a0->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(local_a0->_RatioSequence).
                         super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6) - 1;
          if (uVar6 <= uVar5) {
            uVar6 = uVar5;
          }
          for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
            if (local_88._M_impl.super__Vector_impl_data._M_start[uVar5] == 2) {
              index = 0;
              uVar6 = uVar5;
              goto LAB_001624f4;
            }
          }
          index = 0;
        }
        else {
          uVar6 = uVar5 + 1;
          do {
            lVar9 = uVar6 - 1;
            uVar6 = uVar6 - 1;
          } while (local_88._M_impl.super__Vector_impl_data._M_start[lVar9] == 1);
          index = index - 1;
        }
LAB_001624f4:
        Ratio::~Ratio(&local_70);
        __return_storage_ptr__ = local_98;
      }
    }
    lVar9 = 0;
    for (uVar6 = 0;
        uVar6 < ((long)(pRVar3->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pRVar3->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) - 1U; uVar6 = uVar6 + 1) {
      if (local_88._M_impl.super__Vector_impl_data._M_start[uVar6] == 1) {
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        dVar10 = exp2((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
        lVar9 = (long)((double)lVar9 + dVar10);
      }
    }
    __return_storage_ptr__->combineCode = lVar9;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

RatioSequence RatioSequence::getNonDesRSWithMinDist() {
    if (this->size() < 2) {
        return *this;
    }
    RatioSequence combinedRS(*this);
    size_t i = 0;   // index for stepping through rs
    long combineCode = 0;
    vector<int> ccArray(this->size(), 0);

    int a = 0; // array index

    while (i < combinedRS.size() - 1) {
        if (combinedRS[i].getRatio() > combinedRS[i + 1].getRatio()) {
            Ratio combinedRatio = Ratio::combine(combinedRS[i], combinedRS[i + 1]);
            combinedRS.erase(i);
            combinedRS.erase(i);
            combinedRS._RatioSequence.insert(combinedRS._RatioSequence.begin() + i, combinedRatio);
            ccArray[a] = 1;
            if (i > 0) {
                i--;
                // go back in the array to the last non-combined ratio
                while (ccArray[a] == 1) {
                    a--;
                }
            } else {
                // we must advance a
                while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                    a++;
                }
            }
        } else {
            ccArray[a] = 0;
            // the ratios are not-descending, so go on to the next pair
            i++;
            // we must jump ahead to the next ratio not considered for combination
            while ((a < this->size() - 1) && (ccArray[a] != 2)) {
                a++;
            }
        }
    }

    for (size_t k = 0; k < this->size() - 1; k++) {
        if (ccArray[k] == 1) {
            combineCode += pow(2, k);
        }
    }
    combinedRS.setCombineCode(combineCode);

    return combinedRS;
}